

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line_printer.cc
# Opt level: O2

void __thiscall LinePrinter::LinePrinter(LinePrinter *this)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  allocator<char> local_39;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  this->have_blank_line_ = true;
  this->console_locked_ = false;
  (this->line_buffer_)._M_dataplus._M_p = (pointer)&(this->line_buffer_).field_2;
  (this->line_buffer_)._M_string_length = 0;
  (this->line_buffer_).field_2._M_local_buf[0] = '\0';
  (this->output_buffer_)._M_dataplus._M_p = (pointer)&(this->output_buffer_).field_2;
  (this->output_buffer_)._M_string_length = 0;
  (this->output_buffer_).field_2._M_local_buf[0] = '\0';
  pcVar3 = getenv("TERM");
  iVar2 = isatty(1);
  if ((pcVar3 == (char *)0x0) || (iVar2 == 0)) {
    this->smart_terminal_ = false;
    this->supports_color_ = false;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,pcVar3,&local_39);
    bVar1 = std::operator!=(&local_38,"dumb");
    this->smart_terminal_ = bVar1;
    std::__cxx11::string::~string((string *)&local_38);
    this->supports_color_ = this->smart_terminal_;
    if ((this->smart_terminal_ & 1U) != 0) {
      return;
    }
  }
  pcVar3 = getenv("CLICOLOR_FORCE");
  if (pcVar3 == (char *)0x0) {
    this->supports_color_ = false;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,pcVar3,&local_39);
    bVar1 = std::operator!=(&local_38,"0");
    this->supports_color_ = bVar1;
    std::__cxx11::string::~string((string *)&local_38);
  }
  return;
}

Assistant:

LinePrinter::LinePrinter() : have_blank_line_(true), console_locked_(false) {
  const char* term = getenv("TERM");
#ifndef _WIN32
  smart_terminal_ = isatty(1) && term && string(term) != "dumb";
#else
  // Disable output buffer.  It'd be nice to use line buffering but
  // MSDN says: "For some systems, [_IOLBF] provides line
  // buffering. However, for Win32, the behavior is the same as _IOFBF
  // - Full Buffering."
  if (term && string(term) == "dumb") {
    smart_terminal_ = false;
  } else {
    setvbuf(stdout, NULL, _IONBF, 0);
    console_ = GetStdHandle(STD_OUTPUT_HANDLE);
    CONSOLE_SCREEN_BUFFER_INFO csbi;
    smart_terminal_ = GetConsoleScreenBufferInfo(console_, &csbi);
  }
#endif
  supports_color_ = smart_terminal_;
  if (!supports_color_) {
    const char* clicolor_force = getenv("CLICOLOR_FORCE");
    supports_color_ = clicolor_force && string(clicolor_force) != "0";
  }
#ifdef _WIN32
  // Try enabling ANSI escape sequence support on Windows 10 terminals.
  if (supports_color_) {
    DWORD mode;
    if (GetConsoleMode(console_, &mode)) {
      if (!SetConsoleMode(console_, mode | ENABLE_VIRTUAL_TERMINAL_PROCESSING)) {
        supports_color_ = false;
      }
    }
  }
#endif
}